

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RC interp(NODE *n)

{
  node *pnVar1;
  int iVar2;
  int nRelations_00;
  int nConditions_00;
  size_t sVar3;
  bool bVar4;
  node *rhs;
  Condition conditions_2 [40];
  uint local_1adc;
  int nConditions_2;
  int bIsValue;
  RelAttr rhsRelAttr;
  Value rhsValue;
  RelAttr relAttr;
  Condition conditions_1 [40];
  undefined1 local_11d8 [4];
  int nConditions_1;
  Value values [40];
  undefined1 local_f48 [4];
  int nValues;
  Condition conditions [40];
  int nConditions;
  char *relations [40];
  undefined1 local_528 [4];
  int nRelations;
  RelAttr relAttrs [40];
  undefined1 local_298 [4];
  int nSelAttrs;
  AttrInfo attrInfos [40];
  int nattrs;
  RC errval;
  NODE *n_local;
  
  attrInfos[0x27].attrLength = 0;
  iVar2 = isatty(0);
  if (iVar2 == 0) {
    echo_query(n);
  }
  switch(n->kind) {
  case N_CREATETABLE:
    sVar3 = strlen((n->u).CREATETABLE.relname);
    if (sVar3 < 0x19) {
      attrInfos[0x27].attrType =
           mk_attr_infos((n->u).CREATETABLE.attrlist,0x28,(AttrInfo *)local_298);
      if ((int)attrInfos[0x27].attrType < 0) {
        print_error("create",attrInfos[0x27].attrType);
      }
      else {
        attrInfos[0x27].attrLength =
             SM_Manager::CreateTable
                       (pSmm,(n->u).CREATETABLE.relname,attrInfos[0x27].attrType,
                        (AttrInfo *)local_298);
      }
    }
    else {
      print_error("create",-9);
    }
    break;
  case N_CREATEINDEX:
    attrInfos[0x27].attrLength =
         SM_Manager::CreateIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    break;
  case N_DROPTABLE:
    attrInfos[0x27].attrLength = SM_Manager::DropTable(pSmm,(n->u).CREATETABLE.relname);
    break;
  case N_DROPINDEX:
    attrInfos[0x27].attrLength =
         SM_Manager::DropIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    break;
  case N_LOAD:
    attrInfos[0x27].attrLength =
         SM_Manager::Load(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    break;
  case N_SET:
    attrInfos[0x27].attrLength =
         SM_Manager::Set(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    break;
  case N_HELP:
    if ((n->u).CREATETABLE.relname == (char *)0x0) {
      attrInfos[0x27].attrLength = SM_Manager::Help(pSmm);
    }
    else {
      attrInfos[0x27].attrLength = SM_Manager::Help(pSmm,(n->u).CREATETABLE.relname);
    }
    break;
  case N_PRINT:
    attrInfos[0x27].attrLength = SM_Manager::Print(pSmm,(n->u).CREATETABLE.relname);
    break;
  case N_QUERY:
    iVar2 = mk_rel_attrs((n->u).QUERY.relattrlist,0x28,(RelAttr *)local_528);
    if (iVar2 < 0) {
      print_error("select",iVar2);
    }
    else {
      nRelations_00 =
           mk_relations((n->u).CREATETABLE.attrlist,0x28,(char **)&stack0xfffffffffffff988);
      if (nRelations_00 < 0) {
        print_error("select",nRelations_00);
      }
      else {
        nConditions_00 = mk_conditions((n->u).QUERY.conditionlist,0x28,(Condition *)local_f48);
        if (nConditions_00 < 0) {
          print_error("select",nConditions_00);
        }
        else {
          attrInfos[0x27].attrLength =
               QL_Manager::Select(pQlm,iVar2,(RelAttr *)local_528,nRelations_00,
                                  (char **)&stack0xfffffffffffff988,nConditions_00,
                                  (Condition *)local_f48);
        }
      }
    }
    break;
  case N_INSERT:
    iVar2 = mk_values((n->u).CREATETABLE.attrlist,0x28,(Value *)local_11d8);
    if (iVar2 < 0) {
      print_error("insert",iVar2);
    }
    else {
      attrInfos[0x27].attrLength =
           QL_Manager::Insert(pQlm,(n->u).CREATETABLE.relname,iVar2,(Value *)local_11d8);
    }
    break;
  case N_DELETE:
    iVar2 = mk_conditions((n->u).CREATETABLE.attrlist,0x28,(Condition *)&relAttr.attrName);
    if (iVar2 < 0) {
      print_error("delete",iVar2);
    }
    else {
      attrInfos[0x27].attrLength =
           QL_Manager::Delete(pQlm,(n->u).CREATETABLE.relname,iVar2,(Condition *)&relAttr.attrName);
    }
    break;
  case N_UPDATE:
    mk_rel_attr((n->u).CREATETABLE.attrlist,(RelAttr *)&rhsValue.data);
    pnVar1 = (n->u).QUERY.conditionlist;
    bVar4 = (pnVar1->u).CREATETABLE.relname == (char *)0x0;
    if (bVar4) {
      mk_value((pnVar1->u).CREATETABLE.attrlist,(Value *)&rhsRelAttr.attrName);
    }
    else {
      mk_rel_attr((pnVar1->u).QUERY.relattrlist,(RelAttr *)&nConditions_2);
    }
    local_1adc = (uint)bVar4;
    iVar2 = mk_conditions((n->u).UPDATE.conditionlist,0x28,(Condition *)&rhs);
    if (iVar2 < 0) {
      print_error("update",iVar2);
    }
    else {
      attrInfos[0x27].attrLength =
           QL_Manager::Update(pQlm,(n->u).CREATETABLE.relname,(RelAttr *)&rhsValue.data,local_1adc,
                              (RelAttr *)&nConditions_2,(Value *)&rhsRelAttr.attrName,iVar2,
                              (Condition *)&rhs);
    }
  }
  return attrInfos[0x27].attrLength;
}

Assistant:

RC interp(NODE *n)
{
   RC errval = 0;         /* returned error value      */

   /* if input not coming from a terminal, then echo the query */
   if(!isatty(0))
      echo_query(n);

   switch(n -> kind){

      case N_CREATETABLE:            /* for CreateTable() */
         {
            int nattrs;
            AttrInfo attrInfos[MAXATTRS];

            /* Make sure relation name isn't too long */
            if(strlen(n -> u.CREATETABLE.relname) > MAXNAME){
               print_error((char*)"create", E_TOOLONG);
               break;
            }

            /* Make a list of AttrInfos suitable for sending to Create */
            nattrs = mk_attr_infos(n -> u.CREATETABLE.attrlist, MAXATTRS, 
                  attrInfos);
            if(nattrs < 0){
               print_error((char*)"create", nattrs);
               break;
            }

            /* Make the call to create */
            errval = pSmm->CreateTable(n->u.CREATETABLE.relname, nattrs, 
                  attrInfos);
            break;
         }   

      case N_CREATEINDEX:            /* for CreateIndex() */

         errval = pSmm->CreateIndex(n->u.CREATEINDEX.relname,
               n->u.CREATEINDEX.attrname);
         break;

      case N_DROPINDEX:            /* for DropIndex() */

         errval = pSmm->DropIndex(n->u.DROPINDEX.relname,
               n->u.DROPINDEX.attrname);
         break;

      case N_DROPTABLE:            /* for DropTable() */

         errval = pSmm->DropTable(n->u.DROPTABLE.relname);
         break;

      case N_LOAD:            /* for Load() */

         errval = pSmm->Load(n->u.LOAD.relname,
               n->u.LOAD.filename);
         break;

      case N_SET:                    /* for Set() */

         errval = pSmm->Set(n->u.SET.paramName,
               n->u.SET.string);
         break;

      case N_HELP:            /* for Help() */

         if (n->u.HELP.relname)
            errval = pSmm->Help(n->u.HELP.relname);
         else
            errval = pSmm->Help();
         break;

      case N_PRINT:            /* for Print() */

         errval = pSmm->Print(n->u.PRINT.relname);
         break;

      case N_QUERY:            /* for Query() */
         {
            int       nSelAttrs = 0;
            RelAttr  relAttrs[MAXATTRS];
            int       nRelations = 0;
            char      *relations[MAXATTRS];
            int       nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of RelAttrs suitable for sending to Query */
            nSelAttrs = mk_rel_attrs(n->u.QUERY.relattrlist, MAXATTRS,
                  relAttrs);
            if(nSelAttrs < 0){
               print_error((char*)"select", nSelAttrs);
               break;
            }

            /* Make a list of relation names suitable for sending to Query */
            nRelations = mk_relations(n->u.QUERY.rellist, MAXATTRS, relations);
            if(nRelations < 0){
               print_error((char*)"select", nRelations);
               break;
            }

            /* Make a list of Conditions suitable for sending to Query */
            nConditions = mk_conditions(n->u.QUERY.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"select", nConditions);
               break;
            }

            /* Make the call to Select */
            errval = pQlm->Select(nSelAttrs, relAttrs,
                  nRelations, relations,
                  nConditions, conditions);
            break;
         }   

      case N_INSERT:            /* for Insert() */
         {
            int nValues = 0;
            Value values[MAXATTRS];

            /* Make a list of Values suitable for sending to Insert */
            nValues = mk_values(n->u.INSERT.valuelist, MAXATTRS, values);
            if(nValues < 0){
               print_error((char*)"insert", nValues);
               break;
            }

            /* Make the call to insert */
            errval = pQlm->Insert(n->u.INSERT.relname,
                  nValues, values);
            break;
         }   

      case N_DELETE:            /* for Delete() */
         {
            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of Conditions suitable for sending to delete */
            nConditions = mk_conditions(n->u.DELETE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"delete", nConditions);
               break;
            }

            /* Make the call to delete */
            errval = pQlm->Delete(n->u.DELETE.relname,
                  nConditions, conditions);
            break;
         }   

      case N_UPDATE:            /* for Update() */
         {
            RelAttr relAttr;

            // The RHS can be either a value or an attribute
            Value rhsValue;
            RelAttr rhsRelAttr;
            int bIsValue;

            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a RelAttr suitable for sending to Update */
            mk_rel_attr(n->u.UPDATE.relattr, relAttr);

            struct node *rhs = n->u.UPDATE.relorvalue;
            if (rhs->u.RELATTR_OR_VALUE.relattr) {
               mk_rel_attr(rhs->u.RELATTR_OR_VALUE.relattr, rhsRelAttr);
               bIsValue = 0;
            } else {
               /* Make a value suitable for sending to update */
               mk_value(rhs->u.RELATTR_OR_VALUE.value, rhsValue);
               bIsValue = 1;
            }

            /* Make a list of Conditions suitable for sending to Update */
            nConditions = mk_conditions(n->u.UPDATE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"update", nConditions);
               break;
            }

            /* Make the call to update */
            errval = pQlm->Update(n->u.UPDATE.relname, relAttr, bIsValue, 
                  rhsRelAttr, rhsValue, nConditions, conditions);
            break;
         }   

      default:   // should never get here
         break;
   }

   return (errval);
}